

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Op.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::UnionOp::UnionOp(UnionOp *this,opType type,XMLSize_t size,MemoryManager *manager)

{
  RefVectorOf<xercesc_4_0::Op> *this_00;
  
  (this->super_Op).fMemoryManager = manager;
  (this->super_Op).fOpType = type;
  (this->super_Op).fNextOp = (Op *)0x0;
  (this->super_Op)._vptr_Op = (_func_int **)&PTR__UnionOp_003f9ab8;
  this_00 = (RefVectorOf<xercesc_4_0::Op> *)XMemory::operator_new(0x30,manager);
  RefVectorOf<xercesc_4_0::Op>::RefVectorOf(this_00,size,false,manager);
  this->fBranches = this_00;
  return;
}

Assistant:

UnionOp::UnionOp(const Op::opType type, const XMLSize_t size, MemoryManager* const manager)
    : Op(type, manager)
      , fBranches(new (manager) RefVectorOf<Op> (size, false, manager)) {

}